

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall Tokenizer::tryToGetNumber(Tokenizer *this)

{
  Mark MVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  Mark *pMVar5;
  runtime_error *this_00;
  allocator<char> local_229;
  _Variadic_union<double> local_228;
  Token local_220;
  string local_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pMVar5 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar5;
  cVar2 = Stream::peek(&this->stream_);
  if ((int)cVar2 - 0x30U < 10) {
    cVar3 = Stream::peek(&this->stream_);
    if (cVar3 == '0') {
      cVar3 = Stream::peek(&this->stream_);
      std::operator<<(local_198,cVar3);
      Stream::advance(&this->stream_);
    }
    else {
      while( true ) {
        cVar3 = Stream::peek(&this->stream_);
        if (9 < (int)cVar3 - 0x30U) break;
        cVar3 = Stream::peek(&this->stream_);
        std::operator<<(local_198,cVar3);
        Stream::advance(&this->stream_);
      }
    }
    cVar3 = Stream::peek(&this->stream_);
    if (cVar3 == '.') {
      cVar3 = Stream::peek(&this->stream_);
      std::operator<<(local_198,cVar3);
      Stream::advance(&this->stream_);
      while( true ) {
        cVar3 = Stream::peek(&this->stream_);
        if (9 < (int)cVar3 - 0x30U) break;
        cVar3 = Stream::peek(&this->stream_);
        std::operator<<(local_198,cVar3);
        Stream::advance(&this->stream_);
      }
    }
    else {
      cVar3 = Stream::peek(&this->stream_);
      if ((int)cVar3 - 0x30U < 10) {
LAB_0014e402:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"Unexpected character!",&local_229);
        makeErrorMessage((string *)&local_220,this,&local_1c8);
        std::runtime_error::runtime_error(this_00,(string *)&local_220);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar3 = Stream::peek(&this->stream_);
      iVar4 = isalpha((int)cVar3);
      if (iVar4 != 0) goto LAB_0014e402;
    }
    std::__cxx11::stringbuf::str();
    local_228 = (_Variadic_union<double>)std::__cxx11::stod((string *)&local_220,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_220);
    local_220.type = Number;
    local_220.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u._M_rest = local_228;
    local_220.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index = '\x01';
    local_220.mark = MVar1;
    Token::operator=(&this->token_,&local_220);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_220.value);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return (int)cVar2 - 0x30U < 10;
}

Assistant:

bool Tokenizer::tryToGetNumber()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(isdigit(stream_.peek()))
  {
    if(stream_.peek() != '0')
    {
      while(isdigit(stream_.peek()))
      {
        ss << stream_.peek();
        stream_.advance();
      }
    }
    else
    {
      ss << stream_.peek();
      stream_.advance();
    }

    if(stream_.peek() == '.')
    {
      ss << stream_.peek();
      stream_.advance();
      while(isdigit(stream_.peek()))
      {
        ss << stream_.peek();
        stream_.advance();
      }
    }
    else if(isdigit(stream_.peek()) || isalpha(stream_.peek()))
      throw std::runtime_error(makeErrorMessage("Unexpected character!"));
  }
  else
    return false;

  try
  {
    const double value = std::stod(ss.str());
    token_ = Token(TokenType::Number, value, mark);
  }
  catch(...)
  {
    throw std::runtime_error(makeErrorMessage("Failed to parse numeric constant!"));
  }
  return true;
}